

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

int Gia_ManFindSharedNode(Gia_Man_t *pNew,Vec_Int_t *vSuper,int iLit0)

{
  int iVar1;
  int iVar2;
  int Lit;
  int iVar3;
  int iVar4;
  int iLit2;
  int iLit1Level;
  int iLit1;
  int i;
  int iLit0_local;
  Vec_Int_t *vSuper_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Vec_IntEntryLast(vSuper);
  iVar2 = Abc_Lit2Var(iVar1);
  iVar2 = Gia_ObjLevelId(pNew,iVar2);
  iLit1Level = Vec_IntSize(vSuper);
  do {
    iLit1Level = iLit1Level + -1;
    if (iLit1Level < 0) goto LAB_0090210c;
    Lit = Vec_IntEntry(vSuper,iLit1Level);
    iVar3 = Abc_Lit2Var(Lit);
    iVar3 = Gia_ObjLevelId(pNew,iVar3);
    if (iVar2 != iVar3) goto LAB_0090210c;
    iVar3 = Abc_Lit2Var(iLit0);
    iVar4 = Abc_Lit2Var(Lit);
  } while ((iVar3 != iVar4) && (iVar3 = Gia_ManHashLookupInt(pNew,iLit0,Lit), iVar3 == 0));
  if (Lit != iVar1) {
    Vec_IntWriteEntry(vSuper,iLit1Level,iVar1);
    iVar1 = Vec_IntSize(vSuper);
    Vec_IntWriteEntry(vSuper,iVar1 + -1,Lit);
  }
LAB_0090210c:
  iVar1 = Vec_IntPop(vSuper);
  return iVar1;
}

Assistant:

int Gia_ManFindSharedNode( Gia_Man_t * pNew, Vec_Int_t * vSuper, int iLit0 )
{
    int i, iLit1 = Vec_IntEntryLast(vSuper);
    // iterate through the nodes whose level is equal to that of the last one
    int iLit1Level = Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit1));
    for ( i = Vec_IntSize(vSuper)-1; i >= 0; i-- )
    {
        int iLit2 = Vec_IntEntry(vSuper, i);
        if ( iLit1Level != Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit2)) )
            break;
        if ( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit2) && !Gia_ManHashLookupInt(pNew, iLit0, iLit2) ) // new node
            continue;
        // swap iLit2 and iLit1
        if ( iLit2 != iLit1 )
        {
            Vec_IntWriteEntry( vSuper, i, iLit1 );
            Vec_IntWriteEntry( vSuper, Vec_IntSize(vSuper)-1, iLit2 );
        }
        break;
    }
    return Vec_IntPop(vSuper);    
}